

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O2

bool __thiscall Memory::ReferencedArenaAdapter::AddStrongReference(ReferencedArenaAdapter *this)

{
  bool bVar1;
  
  CCLock::Enter(&(this->adapterLock).super_CCLock);
  bVar1 = this->deleteFlag;
  if (bVar1 == true) {
    if ((this->arena != (ArenaAllocator *)0x0) && (this->strongRefCount == 0)) {
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
                (&HeapAllocator::Instance,this->arena);
      this->arena = (ArenaAllocator *)0x0;
    }
  }
  else {
    this->strongRefCount = this->strongRefCount + 1;
  }
  CCLock::Leave(&(this->adapterLock).super_CCLock);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool AddStrongReference()
    {
        bool retval = false;
        adapterLock.Enter();

        if (deleteFlag)
        {
            // Arena exists and is marked deleted, we must fail to acquire a new reference
            if (arena && 0 == strongRefCount)
            {
                // All strong references are gone, delete the arena
                HeapDelete(this->arena);
                this->arena = nullptr;
            }
        }
        else
        {
            // Succeed at acquiring a Strong Reference into the Arena
            strongRefCount++;
            retval = true;
        }

        adapterLock.Leave();

        return retval;
    }